

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

float64 determinant(float32 **a,int32 n)

{
  undefined8 *tmpptr;
  long lVar1;
  float64 fVar2;
  char uplo;
  int32 info;
  char local_35;
  int local_34;
  double local_30;
  int32 local_24;
  
  local_24 = n;
  tmpptr = (undefined8 *)
           __ckd_calloc_2d__((long)n,(long)n,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                             ,0x9d);
  memcpy((void *)*tmpptr,*a,(ulong)(uint)(n * n) << 2);
  local_35 = 'L';
  spotrf_(&local_35,&local_24,(real *)*tmpptr,&local_24,&local_34);
  local_30 = (double)*(float *)*tmpptr;
  if (1 < (long)local_24) {
    lVar1 = 1;
    do {
      local_30 = local_30 * (double)*(float *)(tmpptr[lVar1] + lVar1 * 4);
      lVar1 = lVar1 + 1;
    } while (local_24 != lVar1);
  }
  ckd_free_2d(tmpptr);
  if (local_34 < 1) {
    fVar2 = (float64)(local_30 * local_30);
  }
  else {
    fVar2 = -1.0;
  }
  return fVar2;
}

Assistant:

float64
determinant(float32 ** a, int32 n)
{
    float32 **tmp_a;
    float64 det;
    char uplo;
    int32 info, i;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));

    uplo = 'L';
    spotrf_(&uplo, &n, tmp_a[0], &n, &info);
    det = tmp_a[0][0];
    /* det = prod(diag(l))^2 */
    for (i = 1; i < n; ++i)
	det *= tmp_a[i][i];
    ckd_free_2d((void **)tmp_a);
    if (info > 0)
	return -1.0; /* Generic "not positive-definite" answer */
    else
	return det * det;
}